

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

void flatcc_json_printer_table_as_nested_root
               (flatcc_json_printer_t *ctx,flatcc_json_printer_table_descriptor_t *td,int id,
               char *name,size_t len,char *fid,flatcc_json_printer_table_f *pf)

{
  char *pcVar1;
  flatbuffers_uoffset_t fVar2;
  flatbuffers_uoffset_t fVar3;
  int iVar4;
  void *pvVar5;
  flatbuffers_uoffset_t bufsiz;
  flatbuffers_uoffset_t *buf;
  char *fid_local;
  size_t len_local;
  char *name_local;
  int id_local;
  flatcc_json_printer_table_descriptor_t *td_local;
  flatcc_json_printer_t *ctx_local;
  
  pvVar5 = get_field_ptr(td,id);
  if (pvVar5 != (void *)0x0) {
    fVar2 = __flatbuffers_uoffset_read_from_pe(pvVar5);
    fVar3 = __flatbuffers_uoffset_read_from_pe((void *)((long)pvVar5 + (ulong)fVar2));
    pvVar5 = (void *)((long)((long)pvVar5 + (ulong)fVar2) + 4);
    iVar4 = accept_header(ctx,pvVar5,(ulong)fVar3,fid);
    if (iVar4 != 0) {
      iVar4 = td->count;
      td->count = iVar4 + 1;
      if (iVar4 != 0) {
        pcVar1 = ctx->p;
        ctx->p = pcVar1 + 1;
        *pcVar1 = ',';
      }
      print_name(ctx,name,len);
      pvVar5 = read_uoffset_ptr(pvVar5);
      print_table_object(ctx,pvVar5,td->ttl,pf);
    }
  }
  return;
}

Assistant:

void flatcc_json_printer_table_as_nested_root(flatcc_json_printer_t *ctx,
        flatcc_json_printer_table_descriptor_t *td,
        int id, const char *name, size_t len,
        const char *fid,
        flatcc_json_printer_table_f pf)
{
    const uoffset_t *buf;
    uoffset_t bufsiz;

    if (0 == (buf = get_field_ptr(td, id))) {
        return;
    }
    buf = (const uoffset_t *)((size_t)buf + __flatbuffers_uoffset_read_from_pe(buf));
    bufsiz = __flatbuffers_uoffset_read_from_pe(buf);
    ++buf;
    if (!accept_header(ctx, buf, bufsiz, fid)) {
        return;
    }
    if (td->count++) {
        print_char(',');
    }
    print_name(ctx, name, len);
    print_table_object(ctx, read_uoffset_ptr(buf), td->ttl, pf);
}